

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManDupOrderDfs_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  
  if (pObj->Value != 0xffffffff) {
    return pObj->Value;
  }
  if ((~(uint)*(undefined8 *)pObj & 0x9fffffff) == 0) {
    uVar1 = Gia_ManAppendCi(pNew);
  }
  else {
    Gia_ManDupOrderDfs_rec(pNew,p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
    uVar1 = (uint)*(undefined8 *)pObj;
    if ((~uVar1 & 0x1fffffff) == 0 || -1 < (int)uVar1) {
      Gia_ManDupOrderDfs_rec
                (pNew,p,pObj + -(ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff));
      iVar2 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar1 = Gia_ManAppendAnd(pNew,iVar2,iLit1);
    }
    else {
      iVar2 = Gia_ObjFanin0Copy(pObj);
      uVar1 = Gia_ManAppendCo(pNew,iVar2);
    }
  }
  pObj->Value = uVar1;
  return uVar1;
}

Assistant:

int Gia_ManDupOrderDfs_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( ~pObj->Value )
        return pObj->Value;
    if ( Gia_ObjIsCi(pObj) )
        return pObj->Value = Gia_ManAppendCi(pNew);
//    if ( p->pNexts && Gia_ObjNext(p, Gia_ObjId(p, pObj)) )
//        Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjNextObj(p, Gia_ObjId(p, pObj)) );
    Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    if ( Gia_ObjIsCo(pObj) )
        return pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin1(pObj) );
    return pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}